

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

FloatBilerpTexture *
pbrt::FloatBilerpTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  TextureMapping2DHandle map;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  FloatBilerpTexture *pFVar2;
  
  TextureMapping2DHandle::Create
            ((TextureMapping2DHandle *)&local_b8,parameters->dict,renderFromTexture,loc,alloc);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"v00","");
  FVar3 = TextureParameterDictionary::GetOneFloat(parameters,&local_50,0.0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"v01","");
  FVar4 = TextureParameterDictionary::GetOneFloat(parameters,&local_70,1.0);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"v10","");
  FVar5 = TextureParameterDictionary::GetOneFloat(parameters,&local_90,0.0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"v11","");
  FVar6 = TextureParameterDictionary::GetOneFloat(parameters,&local_b0,1.0);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pFVar2 = (FloatBilerpTexture *)CONCAT44(extraout_var,iVar1);
  (pFVar2->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = local_b8.bits;
  pFVar2->v00 = FVar3;
  pFVar2->v01 = FVar4;
  pFVar2->v10 = FVar5;
  pFVar2->v11 = FVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return pFVar2;
}

Assistant:

FloatBilerpTexture *FloatBilerpTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    return alloc.new_object<FloatBilerpTexture>(
        map, parameters.GetOneFloat("v00", 0.f), parameters.GetOneFloat("v01", 1.f),
        parameters.GetOneFloat("v10", 0.f), parameters.GetOneFloat("v11", 1.f));
}